

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedFieldsDebugString2023_Test::
TestBody(ValidationErrorTest_ReservedFieldsDebugString2023_Test *this)

{
  FileDescriptor *this_00;
  char *message;
  string_view file_text;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28;
  
  file_text._M_str =
       "\n    syntax: \"editions\"\n    edition: EDITION_2023\n    name: \"foo.proto\"\n    message_type {\n      name: \"Foo\"\n      reserved_name: \"foo\"\n      reserved_name: \"bar\"\n      reserved_range { start: 5 end: 6 }\n      reserved_range { start: 10 end: 20 }\n    }"
  ;
  file_text._M_len = 0xfc;
  this_00 = ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  FileDescriptor::DebugString_abi_cxx11_(&local_28,this_00);
  testing::internal::CmpHelperEQ<char[82],std::__cxx11::string>
            (local_38,
             "\"edition = \\\"2023\\\";\\n\\n\" \"message Foo {\\n\" \"  reserved 5, 10 to 19;\\n\" \"  reserved foo, bar;\\n\" \"}\\n\\n\""
             ,"file->DebugString()",
             (char (*) [82])
             "edition = \"2023\";\n\nmessage Foo {\n  reserved 5, 10 to 19;\n  reserved foo, bar;\n}\n\n"
             ,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x13a4,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedFieldsDebugString2023) {
  const FileDescriptor* file = BuildFile(R"pb(
    syntax: "editions"
    edition: EDITION_2023
    name: "foo.proto"
    message_type {
      name: "Foo"
      reserved_name: "foo"
      reserved_name: "bar"
      reserved_range { start: 5 end: 6 }
      reserved_range { start: 10 end: 20 }
    })pb");

  ASSERT_EQ(
      "edition = \"2023\";\n\n"
      "message Foo {\n"
      "  reserved 5, 10 to 19;\n"
      "  reserved foo, bar;\n"
      "}\n\n",
      file->DebugString());
}